

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall
Fossilize::StreamArchive::decode_payload_uncompressed
          (StreamArchive *this,void *blob,size_t blob_size,Entry *entry,bool concurrent)

{
  bool bVar1;
  int iVar2;
  LogLevel LVar3;
  size_t sVar4;
  mz_ulong mVar5;
  ulong __n;
  ConditionalLockGuard holder;
  
  if ((entry->header).uncompressed_size != blob_size) {
    return false;
  }
  if ((entry->header).payload_size != blob_size) {
    return false;
  }
  holder.lock = &this->read_lock;
  holder.enable = concurrent;
  if (concurrent) {
    std::mutex::lock(holder.lock);
  }
  iVar2 = fseek((FILE *)this->file,entry->offset,0);
  if (iVar2 < 0) {
    ConditionalLockGuard::~ConditionalLockGuard(&holder);
  }
  else {
    __n = (ulong)(entry->header).payload_size;
    sVar4 = fread(blob,1,__n,(FILE *)this->file);
    ConditionalLockGuard::~ConditionalLockGuard(&holder);
    if (sVar4 == __n) {
      if ((entry->header).crc == 0) {
        return true;
      }
      mVar5 = mz_crc32(0,(mz_uint8 *)blob,blob_size);
      if ((entry->header).crc == (uint32_t)mVar5) {
        return true;
      }
      LVar3 = get_thread_log_level();
      if ((int)LVar3 < 3) {
        bVar1 = Internal::log_thread_callback(LOG_ERROR,"CRC mismatch!\n");
        if (bVar1) {
          return false;
        }
        fwrite("Fossilize ERROR: CRC mismatch!\n",0x1f,1,_stderr);
      }
    }
  }
  return false;
}

Assistant:

bool decode_payload_uncompressed(void *blob, size_t blob_size, const Entry &entry, bool concurrent)
	{
		if (entry.header.uncompressed_size != blob_size || entry.header.payload_size != blob_size)
			return false;

		{
			ConditionalLockGuard holder(read_lock, concurrent);
			if (fseek(file, entry.offset, SEEK_SET) < 0)
				return false;

			size_t read_size = entry.header.payload_size;
			if (fread(blob, 1, read_size, file) != read_size)
				return false;
		}

		if (entry.header.crc != 0) // Verify checksum.
		{
			auto disk_crc = uint32_t(mz_crc32(MZ_CRC32_INIT, static_cast<unsigned char *>(blob), blob_size));
			if (disk_crc != entry.header.crc)
			{
				LOGE_LEVEL("CRC mismatch!\n");
				return false;
			}
		}

		return true;
	}